

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_183ce9::readFirstPart(string *fn)

{
  int pixelType;
  char *pcVar1;
  bool ytc;
  bool ytc_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 in_R10B;
  DeepScanLineInputFile part_1;
  Box2i b2;
  Array2D<unsigned_int> sampleCount;
  InputFile part;
  Array2D<half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  FrameBuffer frameBuffer;
  
  uData._sizeX = 0;
  uData._sizeY = 0;
  uData._data = (uint *)0x0;
  fData._sizeX = 0;
  fData._sizeY = 0;
  fData._data = (float *)0x0;
  hData._sizeX = 0;
  hData._sizeY = 0;
  hData._data = (half *)0x0;
  deepUData._sizeX = 0;
  deepUData._sizeY = 0;
  deepUData._data = (uint **)0x0;
  deepFData._sizeX = 0;
  deepFData._sizeY = 0;
  deepFData._data = (float **)0x0;
  deepHData._sizeX = 0;
  deepHData._sizeY = 0;
  deepHData._data = (half **)0x0;
  sampleCount._sizeX = 0;
  sampleCount._sizeY = 0;
  sampleCount._data = (uint *)0x0;
  std::operator<<((ostream *)&std::cout,"Reading first part ");
  std::ostream::flush();
  if (*(anonymous_namespace)::partTypes < 4) {
    pixelType = *(anonymous_namespace)::pixelTypes;
    iVar8 = *(anonymous_namespace)::levelModes;
    switch(*(anonymous_namespace)::partTypes) {
    case 0:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile(&part,pcVar1,iVar8);
      iVar4 = random_int(0x10b);
      iVar3 = random_int(0x10b);
      iVar8 = iVar3;
      if (iVar4 < iVar3) {
        iVar8 = iVar4;
      }
      if (iVar3 < iVar4) {
        iVar3 = iVar4;
      }
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setInputFrameBuffer(&frameBuffer,pixelType,&uData,&fData,&hData,0xc1,0x10b);
      Imf_2_5::InputFile::setFrameBuffer(&part,&frameBuffer);
      Imf_2_5::InputFile::readPixels(&part,iVar8,iVar3);
      if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>(&uData,0,0xc0,iVar8,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3a3,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&fData,0,0xc0,iVar8,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<float>(fData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3a6,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 2) {
        bVar2 = checkPixels<half>(&hData,0,0xc0,iVar8,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<half>(hData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3a9,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&frameBuffer);
      Imf_2_5::InputFile::~InputFile(&part);
      break;
    case 1:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar3 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&part,pcVar1,iVar3);
      iVar3 = Imf_2_5::TiledInputFile::numXLevels((TiledInputFile *)&part);
      iVar4 = Imf_2_5::TiledInputFile::numYLevels((TiledInputFile *)&part);
      iVar5 = random_int(iVar3);
      iVar3 = random_int(iVar4);
      if (iVar8 == 1) {
        iVar3 = iVar5;
      }
      iVar6 = Imf_2_5::TiledInputFile::levelWidth((TiledInputFile *)&part,iVar5);
      iVar7 = Imf_2_5::TiledInputFile::levelHeight((TiledInputFile *)&part,iVar3);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&part,iVar5);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&part,iVar3);
      iVar10 = random_int(iVar8);
      iVar4 = random_int(iVar8);
      iVar11 = random_int(iVar9);
      iVar9 = random_int(iVar9);
      iVar8 = iVar4;
      if (iVar10 < iVar4) {
        iVar8 = iVar10;
      }
      if (iVar4 < iVar10) {
        iVar4 = iVar10;
      }
      iVar10 = iVar9;
      if (iVar11 < iVar9) {
        iVar10 = iVar11;
      }
      if (iVar9 < iVar11) {
        iVar9 = iVar11;
      }
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setInputFrameBuffer(&frameBuffer,pixelType,&uData,&fData,&hData,iVar6,iVar7);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&part,&frameBuffer);
      Imf_2_5::TiledInputFile::readTiles
                ((TiledInputFile *)&part,iVar8,iVar4,iVar10,iVar9,iVar5,iVar3);
      Imf_2_5::TiledInputFile::dataWindowForTile
                ((TiledInputFile *)&part_1,(int)&part,iVar8,iVar10,iVar5);
      Imf_2_5::TiledInputFile::dataWindowForTile((TiledInputFile *)&b2,(int)&part,iVar4,iVar9,iVar5)
      ;
      if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>
                          (&uData,(int)part_1.super_GenericInputFile._vptr_GenericInputFile,b2.max.x
                           ,part_1.super_GenericInputFile._vptr_GenericInputFile._4_4_,b2.max.y,
                           iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3d8,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&fData,(int)part_1.super_GenericInputFile._vptr_GenericInputFile,
                                   b2.max.x,part_1.super_GenericInputFile._vptr_GenericInputFile.
                                            _4_4_,b2.max.y,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3dc,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 2) {
        bVar2 = checkPixels<half>(&hData,(int)part_1.super_GenericInputFile._vptr_GenericInputFile,
                                  b2.max.x,part_1.super_GenericInputFile._vptr_GenericInputFile.
                                           _4_4_,b2.max.y,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3e0,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&frameBuffer);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&part);
      break;
    case 2:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile(&part_1,pcVar1,iVar8);
      Imf_2_5::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&frameBuffer);
      Imf_2_5::Array2D<unsigned_int>::resizeErase(&sampleCount,0x10b,0xc1);
      Imf_2_5::Slice::Slice
                ((Slice *)&part,UINT,(char *)sampleCount._data,4,0x304,1,1,0.0,(bool)in_R10B,ytc);
      Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
                ((DeepFrameBuffer *)&frameBuffer,(Slice *)&part);
      setInputDeepFrameBuffer
                ((DeepFrameBuffer *)&frameBuffer,pixelType,&deepUData,&deepFData,&deepHData,0xc1,
                 0x10b);
      Imf_2_5::DeepScanLineInputFile::setFrameBuffer(&part_1,(DeepFrameBuffer *)&frameBuffer);
      iVar4 = random_int(0x10b);
      iVar3 = random_int(0x10b);
      iVar8 = iVar3;
      if (iVar4 < iVar3) {
        iVar8 = iVar4;
      }
      if (iVar3 < iVar4) {
        iVar3 = iVar4;
      }
      Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts(&part_1,iVar8,iVar3);
      bVar2 = checkSampleCount(&sampleCount,0,0xc0,iVar8,iVar3,0xc1);
      if (!bVar2) {
        __assert_fail("checkSampleCount(sampleCount, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x3fd,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      allocatePixels(pixelType,&sampleCount,&deepUData,&deepFData,&deepHData,0,0xc0,iVar8,iVar3);
      Imf_2_5::DeepScanLineInputFile::readPixels(&part_1,iVar8,iVar3);
      if (pixelType == 2) {
        bVar2 = checkPixels<half>(&sampleCount,&deepHData,0,0xc0,iVar8,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<half>(sampleCount, deepHData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x40d,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&sampleCount,&deepFData,0,0xc0,iVar8,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<float>(sampleCount, deepFData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x40a,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>(&sampleCount,&deepUData,0,0xc0,iVar8,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, 0, width - 1, l1, l2, width)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x407,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      releasePixels(pixelType,&deepUData,&deepFData,&deepHData,0,0xc0,iVar8,iVar3);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile(&part_1);
      break;
    case 3:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar3 = Imf_2_5::globalThreadCount();
      Imf_2_5::DeepTiledInputFile::DeepTiledInputFile((DeepTiledInputFile *)&part_1,pcVar1,iVar3);
      iVar3 = Imf_2_5::DeepTiledInputFile::numXLevels((DeepTiledInputFile *)&part_1);
      iVar4 = Imf_2_5::DeepTiledInputFile::numYLevels((DeepTiledInputFile *)&part_1);
      iVar5 = random_int(iVar3);
      iVar3 = random_int(iVar4);
      if (iVar8 == 1) {
        iVar3 = iVar5;
      }
      iVar6 = Imf_2_5::DeepTiledInputFile::levelWidth((DeepTiledInputFile *)&part_1,iVar5);
      iVar7 = Imf_2_5::DeepTiledInputFile::levelHeight((DeepTiledInputFile *)&part_1,iVar3);
      iVar8 = Imf_2_5::DeepTiledInputFile::numXTiles((DeepTiledInputFile *)&part_1,iVar5);
      iVar9 = Imf_2_5::DeepTiledInputFile::numYTiles((DeepTiledInputFile *)&part_1,iVar3);
      iVar10 = random_int(iVar8);
      iVar4 = random_int(iVar8);
      iVar11 = random_int(iVar9);
      iVar9 = random_int(iVar9);
      iVar8 = iVar4;
      if (iVar10 < iVar4) {
        iVar8 = iVar10;
      }
      if (iVar4 < iVar10) {
        iVar4 = iVar10;
      }
      iVar10 = iVar9;
      if (iVar11 < iVar9) {
        iVar10 = iVar11;
      }
      if (iVar9 < iVar11) {
        iVar9 = iVar11;
      }
      Imf_2_5::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&frameBuffer);
      Imf_2_5::Array2D<unsigned_int>::resizeErase(&sampleCount,(long)iVar7,(long)iVar6);
      Imf_2_5::Slice::Slice
                ((Slice *)&part,UINT,(char *)sampleCount._data,4,(long)iVar6 << 2,1,1,0.0,
                 (bool)in_R10B,ytc_00);
      Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
                ((DeepFrameBuffer *)&frameBuffer,(Slice *)&part);
      setInputDeepFrameBuffer
                ((DeepFrameBuffer *)&frameBuffer,pixelType,&deepUData,&deepFData,&deepHData,iVar6,
                 iVar7);
      Imf_2_5::DeepTiledInputFile::setFrameBuffer
                ((DeepTiledInputFile *)&part_1,(DeepFrameBuffer *)&frameBuffer);
      Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
                ((DeepTiledInputFile *)&part_1,iVar8,iVar4,iVar10,iVar9,iVar5,iVar3);
      Imf_2_5::DeepTiledInputFile::dataWindowForTile
                ((DeepTiledInputFile *)&part,(int)&part_1,iVar8,iVar10,iVar5);
      Imf_2_5::DeepTiledInputFile::dataWindowForTile
                ((DeepTiledInputFile *)&b2,(int)&part_1,iVar4,iVar9,iVar5);
      bVar2 = checkSampleCount(&sampleCount,(int)part.super_GenericInputFile._vptr_GenericInputFile,
                               b2.max.x,part.super_GenericInputFile._vptr_GenericInputFile._4_4_,
                               b2.max.y,iVar6);
      if (!bVar2) {
        __assert_fail("checkSampleCount(sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x43e,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      allocatePixels(pixelType,&sampleCount,&deepUData,&deepFData,&deepHData,
                     (int)part.super_GenericInputFile._vptr_GenericInputFile,b2.max.x,
                     part.super_GenericInputFile._vptr_GenericInputFile._4_4_,b2.max.y);
      Imf_2_5::DeepTiledInputFile::readTiles
                ((DeepTiledInputFile *)&part_1,iVar8,iVar4,iVar10,iVar9,iVar5,iVar3);
      if (pixelType == 2) {
        bVar2 = checkPixels<half>(&sampleCount,&deepHData,
                                  (int)part.super_GenericInputFile._vptr_GenericInputFile,b2.max.x,
                                  part.super_GenericInputFile._vptr_GenericInputFile._4_4_,b2.max.y,
                                  iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<half>(sampleCount, deepHData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x452,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&sampleCount,&deepFData,
                                   (int)part.super_GenericInputFile._vptr_GenericInputFile,b2.max.x,
                                   part.super_GenericInputFile._vptr_GenericInputFile._4_4_,b2.max.y
                                   ,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<float>(sampleCount, deepFData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x44e,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>
                          (&sampleCount,&deepUData,
                           (int)part.super_GenericInputFile._vptr_GenericInputFile,b2.max.x,
                           part.super_GenericInputFile._vptr_GenericInputFile._4_4_,b2.max.y,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x44a,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      releasePixels(pixelType,&deepUData,&deepFData,&deepHData,
                    (int)part.super_GenericInputFile._vptr_GenericInputFile,b2.max.x,
                    part.super_GenericInputFile._vptr_GenericInputFile._4_4_,b2.max.y);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_2_5::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)&part_1);
    }
  }
  Imf_2_5::Array2D<unsigned_int>::~Array2D(&sampleCount);
  Imf_2_5::Array2D<half_*>::~Array2D(&deepHData);
  Imf_2_5::Array2D<float_*>::~Array2D(&deepFData);
  Imf_2_5::Array2D<unsigned_int_*>::~Array2D(&deepUData);
  Imf_2_5::Array2D<half>::~Array2D(&hData);
  Imf_2_5::Array2D<float>::~Array2D(&fData);
  Imf_2_5::Array2D<unsigned_int>::~Array2D(&uData);
  return;
}

Assistant:

void
readFirstPart (const std::string & fn)
{
    Array2D<unsigned int> uData;
    Array2D<float> fData;
    Array2D<half> hData;
    
    Array2D<unsigned int*> deepUData;
    Array2D<float*> deepFData;
    Array2D<half*> deepHData;
    
    Array2D<unsigned int> sampleCount;
    
    cout << "Reading first part " << flush;
    int pixelType = pixelTypes[0];
    int partType = partTypes[0];
    int levelMode = levelModes[0];
    switch (partType)
    {
        case 0:
        {
            InputFile part (fn.c_str());

            int l1, l2;
            l1 = random_int(height);
            l2 = random_int(height);
            if (l1 > l2) swap(l1, l2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer(frameBuffer, pixelType,
                                uData, fData, hData, width, height);

            part.setFrameBuffer(frameBuffer);
            part.readPixels(l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert(checkPixels<float>(fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert(checkPixels<half>(hData, 0, width - 1, l1, l2, width));
                    break;
            }

            break;
        }
        case 1:
        {
            TiledInputFile part(fn.c_str());

            int tx1, tx2, ty1, ty2;
            int lx, ly;


            int numXLevels = part.numXLevels();
            int numYLevels = part.numYLevels();

            lx = random_int(numXLevels);
            ly = random_int(numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth(lx);
            int h = part.levelHeight(ly);

            int numXTiles = part.numXTiles(lx);
            int numYTiles = part.numYTiles(ly);
            tx1 = random_int(numXTiles);
            tx2 = random_int(numXTiles);
            ty1 = random_int(numYTiles);
            ty2 = random_int(numYTiles);
            if (tx1 > tx2) swap(tx1, tx2);
            if (ty1 > ty2) swap(ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer(frameBuffer, pixelType,
                                uData, fData, hData, w, h);

            part.setFrameBuffer(frameBuffer);
            part.readTiles(tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile(tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile(tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                            w));
                    break;
                case 1:
                    assert(checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                            w));
                    break;
                case 2:
                    assert(checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                            w));
                    break;
            }

            break;
        }
        case 2:
        {
            DeepScanLineInputFile part (fn.c_str());

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase(height, width);
            frameBuffer.insertSampleCountSlice (Slice (OPENEXR_IMF_NAMESPACE::UINT,
                    (char *) (&sampleCount[0][0]),
                    sizeof (unsigned int) * 1,
                    sizeof (unsigned int) * width));

            setInputDeepFrameBuffer(frameBuffer, pixelType,
                                    deepUData, deepFData, deepHData, width, height);

            part.setFrameBuffer(frameBuffer);

            int l1, l2;
            l1 = random_int(height);
            l2 = random_int(height);
            if (l1 > l2) swap(l1, l2);

            part.readPixelSampleCounts(l1, l2);
            assert(checkSampleCount(sampleCount, 0, width - 1, l1, l2, width));

            allocatePixels(pixelType, sampleCount,
                           deepUData, deepFData, deepHData, 0, width - 1, l1, l2);

            part.readPixels(l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(sampleCount, deepUData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert(checkPixels<float>(sampleCount, deepFData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert(checkPixels<half>(sampleCount, deepHData, 0, width - 1, l1, l2, width));
                    break;
            }

            releasePixels(pixelType, deepUData, deepFData, deepHData, 0, width - 1, l1, l2);

            break;
        }
        case 3:
        {
            DeepTiledInputFile part (fn.c_str());
            int numXLevels = part.numXLevels();
            int numYLevels = part.numYLevels();

            int tx1, tx2, ty1, ty2;
            int lx, ly;
            lx = random_int(numXLevels);
            ly = random_int(numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth(lx);
            int h = part.levelHeight(ly);

            int numXTiles = part.numXTiles(lx);
            int numYTiles = part.numYTiles(ly);
            tx1 = random_int(numXTiles);
            tx2 = random_int(numXTiles);
            ty1 = random_int(numYTiles);
            ty2 = random_int(numYTiles);
            if (tx1 > tx2) swap(tx1, tx2);
            if (ty1 > ty2) swap(ty1, ty2);

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase(h, w);
            frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                    (char *) (&sampleCount[0][0]),
                    sizeof (unsigned int) * 1,
                    sizeof (unsigned int) * w));

            setInputDeepFrameBuffer(frameBuffer, pixelType,
                                    deepUData, deepFData, deepHData, w, h);

            part.setFrameBuffer(frameBuffer);

            part.readPixelSampleCounts(tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile(tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile(tx2, ty2, lx, ly);
            assert(checkSampleCount(sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));

            allocatePixels(pixelType, sampleCount,
                           deepUData, deepFData, deepHData,
                           b1.min.x, b2.max.x, b1.min.y, b2.max.y);

            part.readTiles(tx1, tx2, ty1, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(sampleCount, deepUData,
                            b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert(checkPixels<float>(sampleCount, deepFData,
                            b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert(checkPixels<half>(sampleCount, deepHData,
                            b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }

            releasePixels(pixelType, deepUData, deepFData, deepHData,
                          b1.min.x, b2.max.x, b1.min.y, b2.max.y);

            break;
        }
    }
}